

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void gameTick(int *isOnGround,int *isOnStairs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EActorType EVar2;
  int *item;
  int *piVar3;
  Item *b;
  Actor *actor;
  void *item_00;
  void **ppvVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  Vec2i *item_01;
  size_t sVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  EDirection EVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  Vec2i VVar19;
  undefined1 auVar20 [16];
  allocator local_51;
  string local_50;
  
  counter = counter + 1;
  if (screen != kGame) {
    return;
  }
  if (0 < ticksUntilVulnerable) {
    ticksUntilVulnerable = ticksUntilVulnerable + -1;
  }
  if (0 < ticksToShowHealth) {
    ticksToShowHealth = ticksToShowHealth + -1;
  }
  if (0 < arrowCooldown) {
    arrowCooldown = arrowCooldown + -1;
  }
  if (player.mHealth == 0) {
    screen = kGameOver;
    prepareScreenFor(kGameOver);
    return;
  }
  if (player.mStance == kAttacking) {
    evaluatePlayerAttack();
    player.mStance = kStanding;
  }
  iVar5 = player.mPosition.mY + 0x2f;
  if (-1 < player.mPosition.mY + 0x10) {
    iVar5 = player.mPosition.mY + 0x10;
  }
  iVar6 = player.mPosition.mX + 0x2f;
  if (-1 < player.mPosition.mX + 0x10) {
    iVar6 = player.mPosition.mX + 0x10;
  }
  *isOnStairs = (uint)(foregroundTiles[iVar5 >> 5][iVar6 >> 5] == 3);
  iVar5 = player.mPosition.mX + 0x1f;
  if (-1 < player.mPosition.mX) {
    iVar5 = player.mPosition.mX;
  }
  iVar6 = player.mPosition.mY + 0x2f;
  if (-1 < player.mPosition.mY + 0x10) {
    iVar6 = player.mPosition.mY + 0x10;
  }
  if (foregroundTiles[iVar6 >> 5]
      [(int)((uint)(player.mDirection == kDirectionRight) + (iVar5 >> 5))] == 1) {
    player.mSpeed.mX = 0;
  }
  iVar5 = player.mPosition.mX + 0x2f;
  if (-1 < player.mPosition.mX + 0x10) {
    iVar5 = player.mPosition.mX + 0x10;
  }
  if ((foregroundTiles[iVar6 >> 5][iVar5 >> 5] == 5) && (ticksUntilVulnerable < 1)) {
    hurtPlayer(1);
  }
  iVar5 = isOnDoor(&player);
  if (iVar5 != 0) {
    room = room + 10;
    hasKey = 0;
    prepareRoom(room);
  }
  VVar19.mX = player.mPosition.mX + player.mSpeed.mX;
  VVar19.mY = player.mPosition.mY + player.mSpeed.mY;
  if (player.mSpeed.mX == 1) {
    player.mSpeed.mX = 0;
  }
  if (player.mSpeed.mY == 1) {
    player.mSpeed.mY = 0;
  }
  player.mPosition = VVar19;
  enforceScreenLimits();
  if (((player.mSpeed.mX == 0) && (player.mSpeed.mY == 0)) && (player.mStance != kAltAttacking)) {
    heroFrame = 0;
  }
  iVar5 = player.mPosition.mY + 0x1f;
  if (-1 < (long)player.mPosition) {
    iVar5 = player.mPosition.mY;
  }
  iVar6 = isOnFloor(&player);
  *isOnGround = iVar6;
  if (*isOnStairs == 0) {
    player.mStance = kJumping;
  }
  else {
    player.mSpeed.mX = 0;
    iVar6 = *isOnGround;
    player.mStance = kClimbing;
  }
  uVar12 = iVar5 >> 5;
  if ((iVar6 == 0) && (*isOnStairs != 0)) {
    iVar5 = 0;
    uVar13 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar13 = 0;
    }
    if (player.mSpeed.mY == 0 || *isOnStairs == 0) {
      if (player.mSpeed.mX != 0) goto LAB_001045cd;
    }
    else {
      heroFrame = (heroFrame - ((heroFrame - (heroFrame + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
      iVar5 = 0;
      if (player.mSpeed.mX != 0) {
        iVar6 = *isOnGround;
        goto LAB_001044c9;
      }
    }
LAB_00104565:
    if (*isOnGround != 0) {
      iVar6 = player.mPosition.mY + 0x1f;
      if (-1 < (long)player.mPosition) {
        iVar6 = player.mPosition.mY;
      }
      player.mPosition = (Vec2i)(CONCAT44(iVar6,player.mPosition.mX) & 0xffffffe0ffffffff);
      player.mSpeed.mX = iVar5;
      if ((*isOnGround != 0) && (*isOnStairs == 0)) {
        player.mSpeed.mY = min(0,player.mSpeed.mY);
        uVar12 = player.mPosition.mY + 0x1f;
        if (-1 < (long)player.mPosition) {
          uVar12 = player.mPosition.mY;
        }
        iVar5 = min(player.mPosition.mY,uVar12 & 0xffffffe0);
        player.mPosition.mY = iVar5;
      }
    }
  }
  else {
    player.mStance = kStanding;
    if (player.mSpeed.mX == 0) {
      iVar5 = 0;
      heroFrame = 0;
      uVar13 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar13 = 0;
      }
      goto LAB_00104565;
    }
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    uVar13 = (ulong)uVar12;
LAB_001044c9:
    if (iVar6 != 0) {
      heroFrame = (heroFrame - ((heroFrame - (heroFrame + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
      iVar5 = player.mSpeed.mX / 2;
      goto LAB_00104565;
    }
  }
LAB_001045cd:
  if (player.mSpeed.mY < 0) {
    iVar5 = player.mPosition.mX + 0x2f;
    if (-1 < player.mPosition.mX + 0x10) {
      iVar5 = player.mPosition.mX + 0x10;
    }
    if (foregroundTiles[uVar13][iVar5 >> 5] != 1) {
      iVar6 = player.mPosition.mY + 0x1f;
      if (-1 < (long)player.mPosition) {
        iVar6 = player.mPosition.mY;
      }
      if (foregroundTiles[iVar6 >> 5][iVar5 >> 5] != 1) goto LAB_0010463f;
    }
    player.mSpeed.mY = -player.mSpeed.mY;
  }
LAB_0010463f:
  iVar5 = player.mSpeed.mY + 2;
  player.mSpeed.mY = 0;
  if (*isOnStairs == 0) {
    player.mSpeed.mY = iVar5;
  }
  if (arrows.used != 0) {
    uVar13 = 0;
    do {
      ppvVar7 = arrows.items;
      item = (int *)arrows.items[uVar13];
      if ((item != (int *)0x0) && (item[8] != 0)) {
        uVar12 = (int)*(undefined8 *)item + (int)*(undefined8 *)(item + 2);
        uVar18 = (int)((ulong)*(undefined8 *)item >> 0x20) +
                 (int)((ulong)*(undefined8 *)(item + 2) >> 0x20);
        *(ulong *)item = CONCAT44(uVar18,uVar12);
        auVar20._0_4_ = -(uint)(-0x7ffffec1 < (int)(uVar12 ^ 0x80000000));
        auVar20._4_4_ = -(uint)(-0x7ffffec1 < (int)(uVar12 ^ 0x80000000));
        auVar20._8_4_ = -(uint)(-0x7fffff39 < (int)(uVar18 ^ 0x80000000));
        auVar20._12_4_ = -(uint)(-0x7fffff39 < (int)(uVar18 ^ 0x80000000));
        iVar5 = movmskpd((int)ppvVar7,auVar20);
        if ((iVar5 == 0) &&
           (foregroundTiles[uVar18 + 0x10 >> 5][(uint)(item[5] == 1) + (uVar12 >> 5)] != 1)) {
          if (foes.used != 0) {
            uVar17 = 0;
            ppvVar7 = foes.items;
            do {
              piVar3 = (int *)ppvVar7[uVar17];
              if (((piVar3 != (int *)0x0) && (piVar3[8] != 0)) && (piVar3[4] != 9)) {
                uVar18 = piVar3[1] - item[1];
                uVar12 = -uVar18;
                if (0 < (int)uVar18) {
                  uVar12 = uVar18;
                }
                if (uVar12 < 0x20) {
                  uVar18 = *piVar3 - *item;
                  uVar12 = -uVar18;
                  if (0 < (int)uVar18) {
                    uVar12 = uVar18;
                  }
                  if (uVar12 < 0x20) {
                    uVar12 = (uint)(0 < (int)uVar18);
                    if (piVar3[5] != 0) {
                      uVar12 = uVar18 >> 0x1f;
                    }
                    if (uVar12 != 0) {
                      piVar3[7] = piVar3[7] + -1;
                      removeFromVector(&arrows,item);
                      free(item);
                      sVar8 = doors.used;
                      ppvVar4 = doors.items;
                      ppvVar7 = foes.items;
                      if ((piVar3[4] == 5) && (doors.used != 0)) {
                        sVar11 = 0;
                        do {
                          if (ppvVar4[sVar11] != (void *)0x0) {
                            *(undefined4 *)((long)ppvVar4[sVar11] + 0x10) = 3;
                          }
                          sVar11 = sVar11 + 1;
                        } while (sVar8 != sVar11);
                      }
                    }
                  }
                }
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < foes.used);
          }
        }
        else {
          removeFromVector(&arrows,item);
          free(item);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < arrows.used);
  }
  if (items.used != 0) {
    paVar1 = &local_50.field_2;
    uVar13 = 0;
    do {
      b = (Item *)items.items[uVar13];
      if (((b != (Item *)0x0) && (b->mActive != 0)) &&
         (iVar5 = collideActorItem(&player,b,0x20), iVar5 != 0)) {
        if ((b->mType == kKey) && (hasKey == 0)) {
          hasKey = 1;
          b->mActive = 0;
          std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
          playTune(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          sVar8 = doors.used;
          ppvVar7 = doors.items;
          if (doors.used != 0) {
            sVar11 = 0;
            do {
              if (ppvVar7[sVar11] != (void *)0x0) {
                *(undefined4 *)((long)ppvVar7[sVar11] + 0x10) = 3;
              }
              sVar11 = sVar11 + 1;
            } while (sVar8 != sVar11);
          }
        }
        else if (b->mType == kMeat) {
          if (player.mHealth < 10) {
            std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
            playTune(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            b->mActive = 0;
            player.mHealth = 10;
            std::__cxx11::string::string((string *)&local_50,pickSound,&local_51);
            playTune(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar1) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          ticksToShowHealth = 0xe;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < items.used);
  }
  if (foes.used != 0) {
    uVar13 = 0;
    do {
      actor = (Actor *)foes.items[uVar13];
      if ((actor != (Actor *)0x0) && (actor->mActive != 0)) {
        EVar2 = actor->mType;
        if (EVar2 == kSpawner) {
          if ((foes.used < 6) && (counter % 0x28 == 0)) {
            item_01 = (Vec2i *)calloc(1,0x24);
            pushVector(&foes,item_01);
            item_01[2].mX = 1;
            item_01[1].mX = 8;
            *item_01 = actor->mPosition;
            item_01[2].mY = 1;
            *(undefined8 *)&item_01[3].mY = 0x100000002;
          }
        }
        else if ((EVar2 == kHand) && (counter % 5 == 0)) {
          iVar5 = (actor->mPosition).mX;
          uVar12 = -(uint)(iVar5 < player.mPosition.mX);
          uVar18 = -(uint)((actor->mPosition).mY < player.mPosition.mY);
          actor->mSpeed =
               (Vec2i)(CONCAT44(uVar18 >> 0x1f,uVar12 >> 0x1f) |
                      CONCAT44(uVar18,uVar12) ^ (ulong)DAT_00106290);
          if (actor->mDirection == kDirectionRight) {
            if (0x9f < iVar5) goto LAB_00104aaf;
          }
          else if ((actor->mDirection == kDirectionLeft) && (iVar5 < 0xa0)) {
LAB_00104aaf:
            (actor->mSpeed).mX = uVar12 | 1;
          }
LAB_00104aba:
          if (actor->mHealth < 1) {
            actor->mActive = 0;
            if (EVar2 == kTinhoso) {
              hasBossOnScreen = 0;
              clearVector(&doors);
            }
            else if (EVar2 == kCapiroto) {
              screen = kVictory;
              prepareScreenFor(kVictory);
              return;
            }
          }
          else if ((EVar2 | kCapiroto) == kHand) {
            iVar5 = (actor->mSpeed).mX;
            iVar6 = (actor->mSpeed).mY;
            iVar9 = (actor->mPosition).mX + iVar5;
            (actor->mPosition).mX = iVar9;
            iVar10 = (actor->mPosition).mY + iVar6;
            (actor->mPosition).mY = iVar10;
            if (iVar9 < 0x120) {
              if (iVar9 < 0) {
                (actor->mSpeed).mX = 8;
                actor->mDirection = kDirectionRight;
                EVar14 = kDirectionRight;
                iVar5 = 8;
              }
              else {
                EVar14 = actor->mDirection;
              }
            }
            else {
              (actor->mSpeed).mX = -8;
              actor->mDirection = kDirectionLeft;
              EVar14 = kDirectionLeft;
              iVar5 = -8;
            }
            iVar15 = iVar9 + 0x1f;
            if (-1 < iVar9) {
              iVar15 = iVar9;
            }
            iVar16 = iVar10 + 0x2f;
            if (-1 < iVar10 + 0x10) {
              iVar16 = iVar10 + 0x10;
            }
            if (foregroundTiles[iVar16 >> 5]
                [(int)((uint)(EVar14 == kDirectionRight) + (iVar15 >> 5))] == 1) {
              (actor->mSpeed).mX = -iVar5;
              EVar14 = (EDirection)(EVar14 == kDirectionLeft);
              actor->mDirection = EVar14;
            }
            if (ticksUntilVulnerable < 1) {
              uVar18 = iVar10 - player.mPosition.mY;
              uVar12 = -uVar18;
              if (0 < (int)uVar18) {
                uVar12 = uVar18;
              }
              if (uVar12 < 0x10) {
                uVar18 = iVar9 - player.mPosition.mX;
                uVar12 = -uVar18;
                if (0 < (int)uVar18) {
                  uVar12 = uVar18;
                }
                if (uVar12 < 0x10) {
                  uVar12 = (uint)(0 < (int)uVar18);
                  if (EVar14 != kDirectionLeft) {
                    uVar12 = uVar18 >> 0x1f;
                  }
                  if (uVar12 != 0) {
                    hurtPlayer(1);
                    iVar6 = (actor->mSpeed).mY;
                  }
                }
              }
            }
            (actor->mSpeed).mY = iVar6 + 2;
            iVar5 = isOnFloor(actor);
            if (iVar5 != 0) {
              (actor->mSpeed).mY = 0;
              uVar12 = (actor->mPosition).mY;
              uVar18 = uVar12 + 0x1f;
              if (-1 < (int)uVar12) {
                uVar18 = uVar12;
              }
              (actor->mPosition).mY = uVar18 & 0xffffffe0;
            }
          }
        }
        else if ((EVar2 < (kCapiroto|kClosedDoor)) && ((0x342U >> (EVar2 & 0x1f) & 1) != 0))
        goto LAB_00104aba;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < foes.used);
    if (foes.used != 0) {
      uVar13 = 0;
      sVar8 = foes.used;
      ppvVar7 = foes.items;
      do {
        item_00 = ppvVar7[uVar13];
        if (((item_00 != (void *)0x0) && (*(int *)((long)item_00 + 0x10) != 5)) &&
           (*(int *)((long)item_00 + 0x1c) < 1)) {
          removeFromVector(&foes,item_00);
          sVar8 = foes.used;
          ppvVar7 = foes.items;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < sVar8);
    }
  }
  return;
}

Assistant:

void gameTick(int *isOnGround, int *isOnStairs) {
	int ceiling;
	size_t pos;
	size_t pos2 = 0;

	++counter;

	if (screen != kGame) {
		return;
	}

	updateTimers();

	if (player.mHealth == 0) {
		screen = kGameOver;
		prepareScreenFor(screen);
		return;
	}

	if (player.mStance == kAttacking) {
		evaluatePlayerAttack();

		player.mStance = kStanding;
	}

	*isOnStairs = (
			foregroundTiles[(player.mPosition.mY + 16) / 32][(player.mPosition.mX + 16) / 32] == 3);

	if (isBlockedByWall(&player)) {
		player.mSpeed.mX = 0;
	}

	if (isOnHarmfulBlock(&player) && ticksUntilVulnerable <= 0) {
		hurtPlayer(1);
	}

	if (isOnDoor(&player)) {
		advanceFloor();
	}

	player.mPosition.mX += player.mSpeed.mX;
	player.mPosition.mY += player.mSpeed.mY;

	if (player.mSpeed.mX == 1) {
		player.mSpeed.mX = 0;
	}

	if (player.mSpeed.mY == 1) {
		player.mSpeed.mY = 0;
	}

	enforceScreenLimits();

	if (player.mSpeed.mX == 0 && player.mSpeed.mY == 0 && player.mStance != kAltAttacking) {
		heroFrame = 0;
	}

	ceiling = (player.mPosition.mY) / 32;

	*isOnGround = isOnFloor(&player);

	if (*isOnStairs) {
		player.mStance = kClimbing;
		player.mSpeed.mX = 0;
	} else {
		player.mStance = kJumping;
	}

	if (*isOnGround || !*isOnStairs) {
		player.mStance = kStanding;

		if (player.mSpeed.mX == 0) {
			heroFrame = 0;
		}

	}

	if (ceiling < 0) {
		ceiling = 0;
	}

	if (player.mSpeed.mY != 0 && player.mStance == kClimbing) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if ((player.mSpeed.mX != 0 && *isOnGround) || player.mStance == kAltAttacking) {
		heroFrame = (heroFrame + 1) % 2;
	}

	if (*isOnGround) {
		player.mSpeed.mX = player.mSpeed.mX / 2;
		player.mPosition.mY = (player.mPosition.mY / 32) * 32;
	}

	if (*isOnGround && !*isOnStairs) {
		player.mSpeed.mY = min(0, player.mSpeed.mY);
		player.mPosition.mY = min(player.mPosition.mY, (player.mPosition.mY / 32) * 32);
	}

	if (player.mSpeed.mY < 0 && foregroundTiles[ceiling][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (player.mSpeed.mY < 0 &&
		foregroundTiles[player.mPosition.mY / 32][(player.mPosition.mX + 16) / 32] == 1) {
		player.mSpeed.mY = -player.mSpeed.mY;
	}

	if (!*isOnStairs) {
		player.mSpeed.mY = player.mSpeed.mY + 2;
/*this prevents from jumping while keeping the climbing animation state.
Unfortunately, prevents looking up.*/

	} else {
		player.mSpeed.mY = 0;
	}

	for (pos = 0; pos < arrows.used; ++pos) {
		struct Actor *arrow =  (struct Actor*)arrows.items[pos];

		if (arrow == NULL) {
			continue;
		}

		if (!arrow->mActive) {
			continue;
		}

		arrow->mPosition.mX += arrow->mSpeed.mX;
		arrow->mPosition.mY += arrow->mSpeed.mY;

		if (arrow->mPosition.mX >= 320 ||
			arrow->mPosition.mX < 0 ||
			arrow->mPosition.mY < 0 ||
			arrow->mPosition.mY >= 200 ||
			isBlockedByWall(arrow)) {

			removeFromVector(&arrows, arrow);
			free(arrow);
			continue;
		}

		for (pos2 = 0; pos2 < foes.used; ++pos2) {
			struct Actor *foe =  (struct Actor*)foes.items[pos2];

			if (foe == NULL || !foe->mActive) {
				continue;
			}

			if (foe->mType != kHand && collideActorActor(foe, arrow, DEFAULT_TOLERANCE)) {
				foe->mHealth--;
				removeFromVector(&arrows, arrow);
				free(arrow);


				if (foe->mType == kGargoyle) {
					openAllDoors();
				}
			}
		}
	}

	for (pos = 0; pos < items.used; ++pos) {

		struct Item *item =  (struct Item*)items.items[pos];

		if (item == NULL || !item->mActive) {
			continue;
		}

		if (collideActorItem(&player, item, DEFAULT_TOLERANCE)) {
			if (item->mType == kKey && !hasKey) {
				hasKey = TRUE;
				item->mActive = FALSE;
				playTune(pickSound);
				openAllDoors();

			} else if (item->mType == kMeat) {
				if (player.mHealth < 10) {
					playTune(pickSound);
					item->mActive = FALSE;
					player.mHealth = 10;
					playTune(pickSound);
				}
				ticksToShowHealth = 14;
			}
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe == NULL || !foe->mActive) {
			continue;
		}

		if (foe->mType == kSpawner) {
			if ((counter % 40) == 0 && (foes.used <= 5)) {
				struct Actor *a = (struct Actor *) calloc(1, sizeof(struct Actor));
				pushVector(&foes, a);
				a->mType = kSkeleton;
				a->mSpeed.mX = 8;
				a->mPosition = foe->mPosition;
				a->mDirection = kDirectionRight;
				a->mActive = TRUE;
				a->mHealth = 2;
			}
			continue;
		}


		if ((counter % 5) == 0 && foe->mType == kHand) {
			int dx = player.mPosition.mX - foe->mPosition.mX;
			int dy = player.mPosition.mY - foe->mPosition.mY;

			if (dx > 0) {
				foe->mSpeed.mX = 1;
			} else {
				foe->mSpeed.mX = -1;
			}

			if (dy > 0) {
				foe->mSpeed.mY = 1;
			} else {
				foe->mSpeed.mY = -1;
			}

			switch (foe->mDirection) {
				case kDirectionLeft:
					if (foe->mPosition.mX < 160) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
				case kDirectionRight:
					if (160 <= foe->mPosition.mX) {
						foe->mSpeed.mX = -foe->mSpeed.mX;
					}
					break;
			}
		}

		if (foe->mType != kSkeleton &&
			foe->mType != kTinhoso &&
			foe->mType != kCapiroto &&
			foe->mType != kHand) {

			continue;
		}

		if (foe->mHealth <= 0) {
			foe->mActive = FALSE;

			if (foe->mType == kCapiroto) {
				screen = kVictory;
				prepareScreenFor(screen);
				return;
			} else if (foe->mType == kTinhoso) {
				hasBossOnScreen = FALSE;

				clearVector(&doors);
			}

			continue;
		}

		if (foe->mType != kSkeleton && foe->mType != kHand) {
			continue;
		}

		foe->mPosition.mX += foe->mSpeed.mX;
		foe->mPosition.mY += foe->mSpeed.mY;

		if (foe->mPosition.mX >= (320 - 32)) {
			foe->mSpeed.mX = -8;
			foe->mDirection = kDirectionLeft;
		}

		if (foe->mPosition.mX < 0) {
			foe->mSpeed.mX = 8;
			foe->mDirection = kDirectionRight;
		}

		if (isBlockedByWall(foe)) {
			foe->mSpeed.mX *= -1;

			if (foe->mDirection == kDirectionLeft) {
				foe->mDirection = kDirectionRight;
			} else {
				foe->mDirection = kDirectionLeft;
			}
		}

		if ((ticksUntilVulnerable <= 0) && collideActorActor(foe, &player, 16)) {
			hurtPlayer(1);
		}

		foe->mSpeed.mY += 2;

		if (isOnFloor(foe)) {
			foe->mSpeed.mY = 0;
			foe->mPosition.mY = (foe->mPosition.mY / 32) * 32;
		}
	}

	for (pos = 0; pos < foes.used; ++pos) {
		struct Actor *foe =  (struct Actor*)foes.items[pos];

		if (foe != NULL && foe->mType != kGargoyle && foe->mHealth <= 0) {
			removeFromVector(&foes, foe);
		}
	}
}